

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  SessionHandle *pSVar1;
  byte *pbVar2;
  int iVar3;
  CURLcode CVar4;
  ushort **ppuVar5;
  bool bVar6;
  byte local_71;
  CURLcode result_1;
  CURLcode result;
  proxy_use proxy;
  int i;
  SessionHandle *data;
  curl_slist *pcStack_50;
  int numlists;
  curl_slist *headers;
  curl_slist *h [2];
  byte *local_30;
  char *ptr;
  Curl_send_buffer *req_buffer_local;
  _Bool is_connect_local;
  connectdata *conn_local;
  
  data._4_4_ = 1;
  pSVar1 = conn->data;
  if (is_connect) {
    result_1 = CURLE_FAILED_INIT;
  }
  else {
    local_71 = 0;
    if (((conn->bits).httpproxy & 1U) != 0) {
      local_71 = (conn->bits).tunnel_proxy ^ 0xff;
    }
    result_1 = (CURLcode)((local_71 & 1) != 0);
  }
  if (((result_1 != CURLE_OK) && (result_1 == CURLE_UNSUPPORTED_PROTOCOL)) &&
     (((pSVar1->set).sep_headers & 1U) != 0)) {
    h[0] = (pSVar1->set).proxyheaders;
    data._4_4_ = 2;
  }
  result = CURLE_OK;
  do {
    if (data._4_4_ <= (int)result) {
      return CURLE_OK;
    }
    for (pcStack_50 = h[(long)(int)result + -1]; pcStack_50 != (curl_slist *)0x0;
        pcStack_50 = pcStack_50->next) {
      local_30 = (byte *)strchr(pcStack_50->data,0x3a);
      if (local_30 == (byte *)0x0) {
        local_30 = (byte *)strchr(pcStack_50->data,0x3b);
        if (local_30 != (byte *)0x0) {
          do {
            pbVar2 = local_30;
            local_30 = pbVar2 + 1;
            bVar6 = false;
            if (*local_30 != 0) {
              ppuVar5 = __ctype_b_loc();
              bVar6 = ((*ppuVar5)[(int)(uint)*local_30] & 0x2000) != 0;
            }
          } while (bVar6);
          if ((*local_30 == 0) && (*pbVar2 == 0x3b)) {
            *pbVar2 = 0x3a;
            CVar4 = Curl_add_bufferf(req_buffer,"%s\r\n",pcStack_50->data);
            goto joined_r0x008948bc;
          }
        }
      }
      else {
        do {
          local_30 = local_30 + 1;
          bVar6 = false;
          if (*local_30 != 0) {
            ppuVar5 = __ctype_b_loc();
            bVar6 = ((*ppuVar5)[(int)(uint)*local_30] & 0x2000) != 0;
          }
        } while (bVar6);
        if ((((*local_30 != 0) &&
             (((conn->allocptr).host == (char *)0x0 ||
              (iVar3 = Curl_raw_nequal("Host:",pcStack_50->data,5), iVar3 == 0)))) &&
            (((pSVar1->set).httpreq != HTTPREQ_POST_FORM ||
             (iVar3 = Curl_raw_nequal("Content-Type:",pcStack_50->data,0xd), iVar3 == 0)))) &&
           (((((conn->bits).authneg & 1U) == 0 ||
             (iVar3 = Curl_raw_nequal("Content-Length",pcStack_50->data,0xe), iVar3 == 0)) &&
            (((conn->allocptr).te == (char *)0x0 ||
             (iVar3 = Curl_raw_nequal("Connection",pcStack_50->data,10), iVar3 == 0)))))) {
          CVar4 = Curl_add_bufferf(req_buffer,"%s\r\n",pcStack_50->data);
joined_r0x008948bc:
          if (CVar4 != CURLE_OK) {
            return CVar4;
          }
        }
      }
    }
    result = result + CURLE_UNSUPPORTED_PROTOCOL;
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists=1; /* by default */
  struct SessionHandle *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i=0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      ptr = strchr(headers->data, ':');
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr) {
          /* only send this if the contents was non-blank */

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length", headers->data))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection", headers->data))
            ;
          else {
            CURLcode result = Curl_add_bufferf(req_buffer, "%s\r\n",
                                               headers->data);
            if(result)
              return result;
          }
        }
      }
      else {
        ptr = strchr(headers->data, ';');
        if(ptr) {

          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
          }
          else {
            if(*(--ptr) == ';') {
              CURLcode result;

              /* send no-value custom header if terminated by semicolon */
              *ptr = ':';
              result = Curl_add_bufferf(req_buffer, "%s\r\n",
                                        headers->data);
              if(result)
                return result;
            }
          }
        }
      }
      headers = headers->next;
    }
  }
  return CURLE_OK;
}